

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

jx9_int64 UnixFile_Write(void *pUserData,void *pBuffer,jx9_int64 nWrite)

{
  ssize_t sVar1;
  ssize_t nWr;
  jx9_int64 nCount;
  void *pvStack_30;
  int fd;
  char *zData;
  jx9_int64 nWrite_local;
  void *pBuffer_local;
  void *pUserData_local;
  
  nWr = 0;
  pvStack_30 = pBuffer;
  zData = (char *)nWrite;
  while ((0 < (long)zData && (sVar1 = write((int)pUserData,pvStack_30,(size_t)zData), 0 < sVar1))) {
    zData = zData + -sVar1;
    nWr = sVar1 + nWr;
    pvStack_30 = (void *)(sVar1 + (long)pvStack_30);
  }
  if ((long)zData < 1) {
    pUserData_local = (void *)nWr;
  }
  else {
    pUserData_local = (void *)0xffffffffffffffff;
  }
  return (jx9_int64)pUserData_local;
}

Assistant:

static jx9_int64 UnixFile_Write(void *pUserData, const void *pBuffer, jx9_int64 nWrite)
{
	const char *zData = (const char *)pBuffer;
	int fd = SX_PTR_TO_INT(pUserData);
	jx9_int64 nCount;
	ssize_t nWr;
	nCount = 0;
	for(;;){
		if( nWrite < 1 ){
			break;
		}
		nWr = write(fd, zData, (size_t)nWrite);
		if( nWr < 1 ){
			/* IO error */
			break;
		}
		nWrite -= nWr;
		nCount += nWr;
		zData += nWr;
	}
	if( nWrite > 0 ){
		return -1;
	}
	return nCount;
}